

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O3

bool __thiscall
libwebm::VpxPesParser::ParsePesOptionalHeader(VpxPesParser *this,PesOptionalHeader *header)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t consumed;
  PacketData poh_buffer;
  size_t local_50;
  PacketData local_48;
  
  if (((header == (PesOptionalHeader *)0x0) || (*(int *)(this + 0x78) != 2)) ||
     (*(ulong *)(this + 0x38) <= *(ulong *)(this + 0x70))) {
    return false;
  }
  local_50 = 0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (byte *)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar3 = RemoveStartCodeEmulationPreventionBytes
                    (this,(uint8_t *)(*(ulong *)(this + 0x70) + *(long *)(this + 0x58)),
                     *(size_t *)(this + 0x18),&local_48,&local_50);
  if (bVar3) {
    header->marker =
         *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start >> 6 & 2;
    header->scrambling =
         *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start >> 4 & 3;
    header->priority =
         *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start >> 3 & 1;
    header->data_alignment =
         *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start >> 2 & 3;
    header->copyright =
         *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start >> 1 & 1;
    header->original =
         *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start & 1;
    bVar1 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    header->has_pts = (uint)(bVar1 >> 7);
    header->has_dts =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[1] >> 6 & 1;
    header->unused_fields =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[1] & 0x3f;
    bVar2 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[2];
    uVar8 = (ulong)bVar2;
    header->remaining_size = (uint)bVar2;
    if ((uint)bVar2 != *(uint *)(this + 0x28)) {
LAB_0010c9a4:
      bVar3 = false;
      goto LAB_0010c9a6;
    }
    lVar6 = 3;
    if ((char)bVar1 < '\0') {
      header->pts_dts_flag =
           local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[3] >> 4 & 2;
      bVar1 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[3];
      if ((((bVar1 & 1) == 0) ||
          ((local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[5] & 1) == 0)) ||
         ((local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[7] & 1) == 0)) goto LAB_0010c9a4;
      uVar4 = ReadUint16(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + 4);
      uVar5 = ReadUint16(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + 6);
      header->pts = (long)(int)((uint)(uVar5 >> 1) | (uVar4 & 0xfffe) << 0xe | (bVar1 & 6) << 0x1d);
      uVar8 = uVar8 - 5;
      lVar6 = 8;
    }
    if (uVar8 != 0) {
      uVar7 = 0;
      do {
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7 + lVar6] != 0xff) goto LAB_0010c9a4;
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
    *(size_t *)(this + 0x70) = *(long *)(this + 0x70) + local_50;
    *(undefined4 *)(this + 0x78) = 3;
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (byte *)0x0) {
    return bVar3;
  }
LAB_0010c9a6:
  operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start);
  return bVar3;
}

Assistant:

bool VpxPesParser::ParsePesOptionalHeader(PesOptionalHeader* header) {
  if (!header || parse_state_ != kParsePesOptionalHeader ||
      read_pos_ >= pes_file_size_) {
    return false;
  }

  std::size_t consumed = 0;
  PacketData poh_buffer;
  if (!RemoveStartCodeEmulationPreventionBytes(&pes_file_data_[read_pos_],
                                               kPesOptionalHeaderSize,
                                               &poh_buffer, &consumed)) {
    return false;
  }

  std::size_t offset = 0;
  header->marker = (poh_buffer[offset] & 0x80) >> 6;
  header->scrambling = (poh_buffer[offset] & 0x30) >> 4;
  header->priority = (poh_buffer[offset] & 0x8) >> 3;
  header->data_alignment = (poh_buffer[offset] & 0xc) >> 2;
  header->copyright = (poh_buffer[offset] & 0x2) >> 1;
  header->original = poh_buffer[offset] & 0x1;
  offset++;

  header->has_pts = (poh_buffer[offset] & 0x80) >> 7;
  header->has_dts = (poh_buffer[offset] & 0x40) >> 6;
  header->unused_fields = poh_buffer[offset] & 0x3f;
  offset++;

  header->remaining_size = poh_buffer[offset];
  if (header->remaining_size !=
      static_cast<int>(kWebm2PesOptHeaderRemainingSize))
    return false;

  size_t bytes_left = header->remaining_size;
  offset++;

  if (header->has_pts) {
    // Read PTS markers. Format:
    // PTS: 5 bytes
    //   4 bits (flag: PTS present, but no DTS): 0x2 ('0010')
    //   36 bits (90khz PTS):
    //     top 3 bits
    //     marker ('1')
    //     middle 15 bits
    //     marker ('1')
    //     bottom 15 bits
    //     marker ('1')
    // TODO(tomfinegan): read/store the timestamp.
    header->pts_dts_flag = (poh_buffer[offset] & 0x20) >> 4;
    // Check the marker bits.
    if ((poh_buffer[offset + 0] & 1) != 1 ||
        (poh_buffer[offset + 2] & 1) != 1 ||
        (poh_buffer[offset + 4] & 1) != 1) {
      return false;
    }

    header->pts = (poh_buffer[offset] & 0xe) << 29 |
                  ((ReadUint16(&poh_buffer[offset + 1]) & ~1) << 14) |
                  (ReadUint16(&poh_buffer[offset + 3]) >> 1);
    offset += 5;
    bytes_left -= 5;
  }

  // Validate stuffing byte(s).
  for (size_t i = 0; i < bytes_left; ++i) {
    if (poh_buffer[offset + i] != 0xff)
      return false;
  }

  read_pos_ += consumed;
  parse_state_ = kParseBcmvHeader;

  return true;
}